

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

void Tas_ManStop(Tas_Man_t *p)

{
  int *__ptr;
  Gia_Obj_t **ppGVar1;
  
  Vec_IntFree(p->vActiveVars);
  Vec_IntFree(p->vWatchLits);
  Vec_IntFree(p->vLevReas);
  Vec_IntFree(p->vModel);
  Vec_PtrFree(p->vTemp);
  if (p->pActivity != (float *)0x0) {
    free(p->pActivity);
    p->pActivity = (float *)0x0;
  }
  if (p->pWatches != (int *)0x0) {
    free(p->pWatches);
    p->pWatches = (int *)0x0;
  }
  __ptr = (p->pStore).pData;
  if (__ptr != (int *)0x0) {
    free(__ptr);
    (p->pStore).pData = (int *)0x0;
  }
  ppGVar1 = (p->pClauses).pData;
  if (ppGVar1 != (Gia_Obj_t **)0x0) {
    free(ppGVar1);
    (p->pClauses).pData = (Gia_Obj_t **)0x0;
  }
  ppGVar1 = (p->pProp).pData;
  if (ppGVar1 != (Gia_Obj_t **)0x0) {
    free(ppGVar1);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  free((p->pJust).pData);
  free(p);
  return;
}

Assistant:

void Tas_ManStop( Tas_Man_t * p )
{
    Vec_IntFree( p->vActiveVars );
    Vec_IntFree( p->vWatchLits );
    Vec_IntFree( p->vLevReas );
    Vec_IntFree( p->vModel );
    Vec_PtrFree( p->vTemp );
    ABC_FREE( p->pActivity );
    ABC_FREE( p->pWatches );
    ABC_FREE( p->pStore.pData );
    ABC_FREE( p->pClauses.pData );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}